

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O1

void __thiscall adios2::utils::Reorganize::Reorganize(Reorganize *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  size_type *psVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 uVar17;
  Reorganize *pRVar18;
  string *this_00;
  string *this_01;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  Comm commWorld;
  string errmsg;
  string __str_2;
  string __str;
  char *end;
  string local_1b0;
  string local_190;
  uint local_16c;
  string local_168;
  string local_148;
  char **local_128;
  string *local_120;
  string *local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  Reorganize *local_f0;
  Reorganize *local_e8 [2];
  undefined1 local_d8 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  _Alloc_hider local_68;
  ulong local_60;
  undefined1 local_58 [24];
  char local_40 [16];
  
  local_58._8_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_58 + 8),"adios_reorganize","");
  local_128 = argv;
  Utils::Utils(&this->super_Utils,(string *)(local_58 + 8),argc,argv);
  if ((char *)local_58._8_8_ != local_40) {
    operator_delete((void *)local_58._8_8_);
  }
  (this->super_Utils)._vptr_Utils = (_func_int **)&PTR__Reorganize_00114ce0;
  (this->m_FileName)._M_dataplus._M_p = (pointer)&(this->m_FileName).field_2;
  (this->m_FileName)._M_string_length = 0;
  (this->m_FileName).field_2._M_local_buf[0] = '\0';
  this_00 = (string *)&this->infilename;
  local_68._M_p = (pointer)&(this->infilename).field_2;
  (this->infilename)._M_dataplus._M_p = local_68._M_p;
  (this->infilename)._M_string_length = 0;
  (this->infilename).field_2._M_local_buf[0] = '\0';
  this_01 = (string *)&this->outfilename;
  local_70 = &(this->outfilename).field_2;
  (this->outfilename)._M_dataplus._M_p = (pointer)local_70;
  (this->outfilename)._M_string_length = 0;
  (this->outfilename).field_2._M_local_buf[0] = '\0';
  local_d8._24_8_ = &this->wmethodname;
  local_78 = (_Base_ptr)&(this->wmethodname).field_2;
  (this->wmethodname)._M_dataplus._M_p = (pointer)local_78;
  (this->wmethodname)._M_string_length = 0;
  (this->wmethodname).field_2._M_local_buf[0] = '\0';
  local_d8._16_8_ = &this->wmethodparam_str;
  local_80 = (_Base_ptr)&(this->wmethodparam_str).field_2;
  (this->wmethodparam_str)._M_dataplus._M_p = (pointer)local_80;
  (this->wmethodparam_str)._M_string_length = 0;
  (this->wmethodparam_str).field_2._M_local_buf[0] = '\0';
  local_d8._40_8_ = &this->rmethodname;
  local_88 = (_Base_ptr)&(this->rmethodname).field_2;
  (this->rmethodname)._M_dataplus._M_p = (pointer)local_88;
  (this->rmethodname)._M_string_length = 0;
  (this->rmethodname).field_2._M_local_buf[0] = '\0';
  local_d8._32_8_ = &this->rmethodparam_str;
  local_90 = &(this->rmethodparam_str).field_2;
  (this->rmethodparam_str)._M_dataplus._M_p = (pointer)local_90;
  (this->rmethodparam_str)._M_string_length = 0;
  (this->rmethodparam_str).field_2._M_local_buf[0] = '\0';
  this->m_Rank = 0;
  this->m_Size = 1;
  local_d8._48_8_ = &this->m_Comm;
  adios2::helper::Comm::Comm((Comm *)local_d8._48_8_);
  p_Var1 = &(this->rmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->wmethodparams)._M_t._M_impl.super__Rb_tree_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->wmethodparams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->write_total = 0;
  this->largest_block = 0;
  this->handleAsStream = true;
  this->decomp_values[0] = 1;
  this->decomp_values[1] = 1;
  this->decomp_values[2] = 1;
  this->decomp_values[3] = 1;
  this->decomp_values[4] = 1;
  this->decomp_values[5] = 1;
  this->decomp_values[6] = 1;
  this->decomp_values[7] = 1;
  this->decomp_values[8] = 1;
  this->decomp_values[9] = 1;
  adios2::helper::CommWithMPI((ompi_communicator_t *)&local_1b0);
  pRVar18 = (Reorganize *)local_d8._48_8_;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity =
       local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_120 = this_01;
  local_118 = this_00;
  adios2::helper::Comm::Split((int)&local_168,(int)&local_1b0,(string *)0x5cb3);
  adios2::helper::Comm::operator=((Comm *)pRVar18,(Comm *)&local_168);
  adios2::helper::Comm::~Comm((Comm *)&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  adios2::helper::Comm::~Comm((Comm *)&local_1b0);
  iVar5 = adios2::helper::Comm::Rank();
  this->m_Rank = iVar5;
  iVar5 = adios2::helper::Comm::Size();
  piVar6 = &this->m_Size;
  *piVar6 = iVar5;
  if (argc < 7) {
    PrintUsage(pRVar18);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Utils","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"AdiosReorganize","");
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Reorganize","");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Not enough arguments. At least 6 are required","");
    helper::Throw<std::invalid_argument>(&local_190,&local_1b0,&local_168,&local_148,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    this_00 = local_118;
    this_01 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::string((string *)&local_190,local_128[1],(allocator *)&local_1b0);
  std::__cxx11::string::operator=(this_00,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_190,local_128[2],(allocator *)&local_1b0);
  std::__cxx11::string::operator=(this_01,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_190,local_128[3],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_d8._40_8_,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_190,local_128[4],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_d8._32_8_,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_190,local_128[5],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_d8._24_8_,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_190,local_128[6],(allocator *)&local_1b0);
  std::__cxx11::string::operator=((string *)local_d8._16_8_,(string *)&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  uVar16 = 0;
  bVar21 = 7 < argc;
  local_f0 = this;
  if (7 < argc) {
    local_d8._64_8_ = piVar6;
    piVar6 = __errno_location();
    local_d8._56_8_ = ZEXT48((uint)argc);
    uVar20 = 5;
    if (argc - 8U < 5) {
      uVar20 = argc - 8U;
    }
    local_60 = (ulong)(uVar20 + 1);
    uVar16 = 0;
    do {
      uVar14 = uVar16;
      *piVar6 = 0;
      lVar7 = strtol(local_128[uVar14 + 7],(char **)local_58,10);
      this->decomp_values[uVar14] = (int)lVar7;
      if ((*piVar6 != 0) ||
         (((char *)local_58._0_8_ != (char *)0x0 && (*(char *)local_58._0_8_ != '\0')))) {
        uVar20 = 2 - (uVar14 + 7 < 10);
        local_e8[0] = (Reorganize *)local_d8;
        std::__cxx11::string::_M_construct((ulong)local_e8,(char)uVar20);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8[0],uVar20,(int)uVar14 + 7);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x110179);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar12 = (size_type *)(plVar8 + 2);
        paVar2 = &local_168.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_148.field_2._M_allocated_capacity = *psVar12;
          local_148.field_2._8_8_ = plVar8[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar12;
          local_148._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_148._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_148);
        puVar13 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168.field_2._8_8_ = plVar8[3];
          local_168._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_168._M_string_length = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::string
                  ((string *)&local_110,local_128[uVar14 + 7],(allocator *)&local_16c);
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar2) {
          uVar17 = local_168.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_108 + local_168._M_string_length) {
          uVar16 = 0xf;
          if (local_110 != local_100) {
            uVar16 = local_100[0];
          }
          if (uVar16 < local_108 + local_168._M_string_length) goto LAB_001086f0;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_110,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
        }
        else {
LAB_001086f0:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_110);
        }
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1b0.field_2._M_allocated_capacity = *psVar12;
          local_1b0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar12;
          local_1b0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1b0._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)psVar12 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190.field_2._8_8_ = plVar8[3];
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_190._M_string_length = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        pRVar18 = local_e8[0];
        if (local_e8[0] != (Reorganize *)local_d8) {
          operator_delete(local_e8[0]);
        }
        PrintUsage(pRVar18);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Utils","");
        local_168._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"AdiosReorganize","");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Reorganize","");
        helper::Throw<std::invalid_argument>(&local_1b0,&local_168,&local_148,&local_190,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
      }
      uVar16 = uVar14 + 1;
    } while (local_60 != uVar16);
    bVar21 = (pointer)(uVar14 + 8) < (ulong)local_d8._56_8_;
    piVar6 = (int *)local_d8._64_8_;
  }
  if (bVar21) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Utils","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"AdiosReorganize","");
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Reorganize","");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Up to 6 decomposition arguments are supported","");
    helper::Throw<std::invalid_argument>(&local_190,&local_1b0,&local_168,&local_148,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
  }
  local_16c = 1;
  if ((int)uVar16 != 0) {
    local_16c = 1;
    uVar14 = 0;
    do {
      local_16c = local_16c * this->decomp_values[uVar14];
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0xffffffff) != uVar14);
  }
  if ((int)local_16c <= *piVar6) {
    return;
  }
  print0<char_const(&)[69],int&,int&>
            (local_f0,(char (*) [69])
                      "ERROR: Product of decomposition numbers %d > number of processes %d\n",
             (int *)&local_16c,piVar6);
  uVar20 = -local_16c;
  if (0 < (int)local_16c) {
    uVar20 = local_16c;
  }
  uVar19 = 1;
  if (9 < uVar20) {
    uVar16 = (ulong)uVar20;
    uVar15 = 4;
    do {
      uVar19 = uVar15;
      uVar10 = (uint)uVar16;
      if (uVar10 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00108ac8;
      }
      if (uVar10 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00108ac8;
      }
      if (uVar10 < 10000) goto LAB_00108ac8;
      uVar16 = uVar16 / 10000;
      uVar15 = uVar19 + 4;
    } while (99999 < uVar10);
    uVar19 = uVar19 + 1;
  }
LAB_00108ac8:
  uVar15 = local_16c >> 0x1f;
  local_e8[0] = (Reorganize *)local_d8;
  std::__cxx11::string::_M_construct((ulong)local_e8,(char)uVar19 - (char)((int)local_16c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&(local_e8[0]->super_Utils)._vptr_Utils + (ulong)uVar15),uVar19,uVar20);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x110224);
  paVar2 = &local_148.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_148.field_2._M_allocated_capacity = *psVar12;
    local_148.field_2._8_8_ = plVar8[3];
    local_148._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar12;
    local_148._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_148._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_148);
  paVar3 = &local_168.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_168.field_2._M_allocated_capacity = *puVar13;
    local_168.field_2._8_8_ = plVar8[3];
    local_168._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_168.field_2._M_allocated_capacity = *puVar13;
    local_168._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_168._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar20 = *piVar6;
  uVar19 = -uVar20;
  if (0 < (int)uVar20) {
    uVar19 = uVar20;
  }
  uVar15 = 1;
  if (9 < uVar19) {
    uVar16 = (ulong)uVar19;
    uVar10 = 4;
    do {
      uVar15 = uVar10;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00108c20;
      }
      if (uVar11 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00108c20;
      }
      if (uVar11 < 10000) goto LAB_00108c20;
      uVar16 = uVar16 / 10000;
      uVar10 = uVar15 + 4;
    } while (99999 < uVar11);
    uVar15 = uVar15 + 1;
  }
LAB_00108c20:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar15 - (char)((int)uVar20 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar20 >> 0x1f) + (long)local_110),uVar15,uVar19);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar3) {
    uVar17 = local_168.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_108 + local_168._M_string_length) {
    uVar16 = 0xf;
    if (local_110 != local_100) {
      uVar16 = local_100[0];
    }
    if (local_108 + local_168._M_string_length <= uVar16) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_110,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
      goto LAB_00108cc6;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_110);
LAB_00108cc6:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar12;
    local_1b0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1b0._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_190.field_2._M_allocated_capacity = *psVar12;
    local_190.field_2._8_8_ = plVar8[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar12;
    local_190._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_190._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paVar4 = &local_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  pRVar18 = local_e8[0];
  if (local_e8[0] != (Reorganize *)local_d8) {
    operator_delete(local_e8[0]);
  }
  PrintUsage(pRVar18);
  local_1b0._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Utils","");
  local_168._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"AdiosReorganize","");
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Reorganize","");
  helper::Throw<std::invalid_argument>(&local_1b0,&local_168,&local_148,&local_190,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar4) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  return;
}

Assistant:

Reorganize::Reorganize(int argc, char *argv[]) : Utils("adios_reorganize", argc, argv)
{
#if ADIOS2_USE_MPI
    {
        auto commWorld = helper::CommWithMPI(MPI_COMM_WORLD);
        m_Comm = commWorld.Split(m_CommSplitColor, 0);
    }
#else
    m_Comm = helper::CommDummy();
#endif
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (argc < 7)
    {
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Not enough arguments. At least 6 are required");
    }
    infilename = std::string(argv[1]);
    outfilename = std::string(argv[2]);
    rmethodname = std::string(argv[3]);
    rmethodparam_str = std::string(argv[4]);
    wmethodname = std::string(argv[5]);
    wmethodparam_str = std::string(argv[6]);

    int nd = 0;
    int j = 7;
    char *end;
    while (argc > j && j < 13)
    { // get max 6 dimensions
        errno = 0;
        decomp_values[nd] = std::strtol(argv[j], &end, 10);
        if (errno || (end != 0 && *end != '\0'))
        {
            std::string errmsg("ERROR: Invalid decomposition number in argument " +
                               std::to_string(j) + ": '" + std::string(argv[j]) + "'\n");
            PrintUsage();
            helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
        }
        nd++;
        j++;
    }

    if (argc > j)
    {
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Up to 6 decomposition arguments are supported");
    }

    int prod = 1;
    for (int i = 0; i < nd; i++)
    {
        prod *= decomp_values[i];
    }

    if (prod > m_Size)
    {
        print0("ERROR: Product of decomposition numbers %d > number of "
               "processes %d\n",
               prod, m_Size);
        std::string errmsg("ERROR: The product of decomposition numbers " + std::to_string(prod) +
                           " > number of processes " + std::to_string(m_Size) + "\n");
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
    }
}